

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

const_iterator __thiscall libcellml::Model::ModelImpl::findUnits(ModelImpl *this,UnitsPtr *units)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<libcellml::Units> *psVar2;
  element_type *this_00;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  __it;
  bool bVar3;
  int iVar4;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  _Var5;
  long lVar6;
  long lVar7;
  shared_ptr<libcellml::Units> *psVar8;
  shared_ptr<libcellml::Units> *psVar9;
  
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<libcellml::Units>const>>
                    ((this->mUnits).
                     super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->mUnits).
                     super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,units);
  psVar2 = (this->mUnits).
           super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var5._M_current != psVar2) {
    return (const_iterator)_Var5._M_current;
  }
  psVar9 = (this->mUnits).
           super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __it._M_current =
       (shared_ptr<libcellml::Units> *)
       (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (__it._M_current != (shared_ptr<libcellml::Units> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_002274f2;
      LOCK();
      p_Var1 = &((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        iVar4 = *(int *)&((__it._M_current)->
                         super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
        goto LAB_002274fa;
      }
      LOCK();
      p_Var1 = &((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') {
        iVar4 = *(int *)&((__it._M_current)->
                         super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
        goto LAB_002274ff;
      }
      LOCK();
      p_Var1 = &((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
LAB_002274f2:
      iVar4 = *(int *)&((__it._M_current)->
                       super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                       ._M_pi + 1;
      *(int *)&((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi = iVar4;
LAB_002274fa:
      iVar4 = iVar4 + 1;
      *(int *)&((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi = iVar4;
LAB_002274ff:
      *(int *)&((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi = iVar4 + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__it._M_current);
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &((__it._M_current)->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  lVar6 = (long)_Var5._M_current - (long)psVar9;
  if (0 < lVar6 >> 6) {
    lVar7 = (lVar6 >> 6) + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                            *)this_00,__it);
      psVar8 = psVar9;
      if (bVar3) goto LAB_00227614;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                            *)this_00,__it);
      psVar8 = psVar9 + 1;
      if (bVar3) goto LAB_00227614;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                            *)this_00,__it);
      psVar8 = psVar9 + 2;
      if (bVar3) goto LAB_00227614;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
              ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                            *)this_00,__it);
      psVar8 = psVar9 + 3;
      if (bVar3) goto LAB_00227614;
      psVar9 = psVar9 + 4;
      lVar7 = lVar7 + -1;
      lVar6 = lVar6 + -0x40;
    } while (1 < lVar7);
  }
  lVar6 = lVar6 >> 4;
  if (lVar6 != 1) {
    psVar8 = psVar9;
    if (lVar6 != 2) {
      psVar8 = psVar2;
      if ((lVar6 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
                  ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                                *)this_00,__it), psVar8 = psVar9, bVar3)) goto LAB_00227614;
      psVar8 = psVar9 + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                          *)this_00,__it);
    if (bVar3) goto LAB_00227614;
    psVar9 = psVar8 + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
          ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                        *)this_00,__it);
  psVar8 = psVar2;
  if (bVar3) {
    psVar8 = psVar9;
  }
LAB_00227614:
  if (__it._M_current != (shared_ptr<libcellml::Units> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__it._M_current);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__it._M_current);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__it._M_current);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__it._M_current);
  }
  return (const_iterator)psVar8;
}

Assistant:

std::vector<UnitsPtr>::const_iterator Model::ModelImpl::findUnits(const UnitsPtr &units) const
{
    auto result = std::find(mUnits.begin(), mUnits.end(), units);
    if (result != mUnits.end()) {
        return result;
    }
    return std::find_if(mUnits.begin(), mUnits.end(),
                        [=](const UnitsPtr &u) -> bool { return u->equals(units); });
}